

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

int Wlc_PrsReadDeclaration(Wlc_Prs_t *p,char *pStart)

{
  Wlc_Obj_t *pObj;
  char cVar1;
  byte bVar2;
  Wlc_Ntk_t *pWVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  int End;
  int Beg;
  int fFound;
  int XValue;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c [3];
  
  local_40 = 0;
  local_44 = 0;
  local_3c[1] = 0;
  local_3c[2] = 0;
  local_48 = 0;
  lVar11 = 5;
  iVar4 = strncmp(pStart,"input",5);
  if (iVar4 == 0) {
    bVar13 = true;
    local_3c[1] = 1;
    local_3c[2] = 0;
  }
  else {
    iVar4 = strncmp(pStart,"output",6);
    bVar13 = iVar4 != 0;
    lVar11 = 0;
    if (!bVar13) {
      lVar11 = 6;
    }
  }
  pcVar7 = pStart + lVar11 + -2;
  do {
    pcVar12 = pcVar7;
    cVar1 = pcVar12[2];
    pcVar7 = pcVar12 + 1;
  } while (cVar1 == ' ');
  lVar11 = 4;
  iVar4 = strncmp(pcVar12 + 2,"wire",4);
  if (iVar4 != 0) {
    if ((cVar1 == 'r') && (pcVar12[3] == 'e')) {
      lVar11 = (ulong)(pcVar12[4] == 'g') * 3;
    }
    else {
      lVar11 = 0;
    }
  }
  pcVar7 = pcVar12 + 1 + lVar11;
  do {
    pcVar12 = pcVar7;
    pcVar7 = pcVar12 + 1;
  } while (pcVar12[1] == ' ');
  iVar4 = strncmp(pcVar7,"signed",6);
  pcVar12 = pcVar12 + 7;
  if (iVar4 != 0) {
    pcVar12 = pcVar7;
  }
  pcVar7 = Wlc_PrsFindRange(pcVar12,(int *)&local_48,(int *)&local_44);
  if (pcVar7 == (char *)0x0) {
    Wlc_PrsWriteErrorMessage(p,pcVar12,"Non-standard range.");
    return 0;
  }
  if ((local_44 != 0 && local_48 != 0) &&
     (iVar10 = p->nNonZero[0], p->nNonZero[0] = iVar10 + 1, iVar10 == 0)) {
    p->nNonZero[1] = local_48;
    p->nNonZero[2] = local_44;
    lVar11 = (long)p->vLines->nSize;
    iVar10 = -1;
    if (0 < lVar11) {
      lVar9 = 0;
      do {
        if ((long)pcVar7 - (long)p->pBuffer < (long)p->vLines->pArray[lVar9]) {
          iVar10 = (int)lVar9 + 1;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar11 != lVar9);
    }
    p->nNonZero[3] = iVar10;
  }
  if (((int)(local_48 | local_44) < 0) &&
     (iVar10 = p->nNegative[0], p->nNegative[0] = iVar10 + 1, iVar10 == 0)) {
    p->nNegative[1] = local_48;
    p->nNegative[2] = local_44;
    lVar11 = (long)p->vLines->nSize;
    iVar10 = -1;
    if (0 < lVar11) {
      lVar9 = 0;
      do {
        if ((long)pcVar7 - (long)p->pBuffer < (long)p->vLines->pArray[lVar9]) {
          iVar10 = (int)lVar9 + 1;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar11 != lVar9);
    }
    p->nNegative[3] = iVar10;
  }
  if (((int)local_48 < (int)local_44) &&
     (iVar10 = p->nReverse[0], p->nReverse[0] = iVar10 + 1, iVar10 == 0)) {
    p->nReverse[1] = local_48;
    p->nReverse[2] = local_44;
    lVar11 = (long)p->vLines->nSize;
    iVar10 = -1;
    if (0 < lVar11) {
      lVar9 = 0;
      do {
        if ((long)pcVar7 - (long)p->pBuffer < (long)p->vLines->pArray[lVar9]) {
          iVar10 = (int)lVar9 + 1;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar11 != lVar9);
    }
    p->nReverse[3] = iVar10;
  }
  do {
    pcVar7 = pcVar7 + -1;
    do {
      bVar2 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while (bVar2 == 0x20);
    pbVar8 = (byte *)Wlc_PrsFindName::Buffer;
    if (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
      if (bVar2 != 0) goto LAB_0037528b;
    }
    else {
      if ((0x3b < bVar2 - 0x24) || ((0x900000000000001U >> ((ulong)(bVar2 - 0x24) & 0x3f) & 1) == 0)
         ) {
        Wlc_PrsWriteErrorMessage(p,(char *)0x0,"Cannot read name in declaration.");
        return 0;
      }
LAB_0037528b:
      bVar14 = true;
      iVar10 = 0;
      do {
        if (bVar14) {
          if (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
            bVar14 = true;
            goto joined_r0x003752db;
          }
          bVar14 = true;
          if (bVar2 != 0x24) {
            if (bVar2 == 0x5c) goto LAB_003752e9;
            if (bVar2 == 0x5f) goto LAB_003752fb;
            break;
          }
        }
        else {
          if (bVar2 == 0x20) {
            iVar10 = iVar10 + -1;
            bVar14 = iVar10 == 0;
            goto LAB_003752fb;
          }
          bVar14 = false;
joined_r0x003752db:
          if (bVar2 == 0x5c) {
LAB_003752e9:
            iVar10 = iVar10 + 1;
            bVar14 = false;
          }
        }
LAB_003752fb:
        *pbVar8 = bVar2;
        pbVar8 = pbVar8 + 1;
        bVar2 = pcVar7[1];
        pcVar7 = pcVar7 + 1;
      } while (bVar2 != 0);
    }
    *pbVar8 = 0;
    uVar5 = Abc_NamStrFindOrAdd(p->pNtk->pManName,Wlc_PrsFindName::Buffer,&local_40);
    if (local_40 != 0) {
      Wlc_PrsWriteErrorMessage
                (p,pcVar7,"Name %s is declared more than once.",Wlc_PrsFindName::Buffer);
      return 0;
    }
    uVar6 = Wlc_ObjAlloc(p->pNtk,(int)local_3c._4_8_,(uint)(iVar4 == 0),local_48,local_44);
    if (!bVar13) {
      if (((int)uVar6 < 1) || (pWVar3 = p->pNtk, pWVar3->nObjsAlloc <= (int)uVar6))
      goto LAB_00375477;
      Wlc_ObjSetCo(pWVar3,pWVar3->pObjs + uVar6,0);
    }
    if (uVar6 != uVar5) {
      __assert_fail("iObj == NameId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                    ,0x3a5,"int Wlc_PrsReadDeclaration(Wlc_Prs_t *, char *)");
    }
    do {
      pcVar12 = pcVar7;
      pcVar7 = pcVar12 + 1;
    } while (*pcVar12 == ' ');
  } while (*pcVar12 == ',');
  iVar4 = Wlc_PrsFindDefinition(p,pcVar12,p->vFanins,(int *)local_3c);
  if (iVar4 != 0) {
    if (((int)uVar5 < 1) || (pWVar3 = p->pNtk, pWVar3->nObjsAlloc <= (int)uVar5)) {
LAB_00375477:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
    pObj = pWVar3->pObjs + uVar5;
    Wlc_ObjUpdateType(pWVar3,pObj,iVar4);
    Wlc_ObjAddFanins(p->pNtk,pObj,p->vFanins);
    *(ushort *)pObj = (ushort)*(undefined4 *)pObj & 0xf7ff | (ushort)((local_3c[0] & 1) << 0xb);
  }
  return 1;
}

Assistant:

int Wlc_PrsReadDeclaration( Wlc_Prs_t * p, char * pStart )
{
    int fFound = 0, Type = WLC_OBJ_NONE, iObj; char * pLine;
    int Signed = 0, Beg = 0, End = 0, NameId, fIsPo = 0;
    if ( Wlc_PrsStrCmp( pStart, "input" ) )
        pStart += strlen("input"), Type = WLC_OBJ_PI;
    else if ( Wlc_PrsStrCmp( pStart, "output" ) )
        pStart += strlen("output"), fIsPo = 1;
    pStart = Wlc_PrsSkipSpaces( pStart );
    if ( Wlc_PrsStrCmp( pStart, "wire" ) )
        pStart += strlen("wire");
    else if ( Wlc_PrsStrCmp( pStart, "reg" ) )
        pStart += strlen("reg");
    // read 'signed'
    pStart = Wlc_PrsFindWord( pStart, "signed", &Signed );
    // read range
    pLine = pStart;
    pStart = Wlc_PrsFindRange( pStart, &End, &Beg );
    if ( pStart == NULL )
        return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
    if ( End != 0 && Beg != 0 )
    {
        if ( p->nNonZero[0]++ == 0 )
        {
            p->nNonZero[1] = End;
            p->nNonZero[2] = Beg;
            p->nNonZero[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < 0 || Beg < 0  )
    {
        if ( p->nNegative[0]++ == 0 )
        {
            p->nNegative[1] = End;
            p->nNegative[2] = Beg;
            p->nNegative[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < Beg )
    {
        if ( p->nReverse[0]++ == 0 )
        {
            p->nReverse[1] = End;
            p->nReverse[2] = Beg;
            p->nReverse[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    while ( 1 )
    {
        char * pName; int XValue, TypeNew;
        // read name
        pStart = Wlc_PrsFindName( pStart, &pName );
        if ( pStart == NULL )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Cannot read name in declaration." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( fFound )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Name %s is declared more than once.", pName );
        iObj = Wlc_ObjAlloc( p->pNtk, Type, Signed, End, Beg );
        if ( fIsPo ) Wlc_ObjSetCo( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), 0 );
        assert( iObj == NameId );
        // check next definition
        pStart = Wlc_PrsSkipSpaces( pStart );
        if ( pStart[0] == ',' )
        {
            pStart++;
            continue;
        }
        // check definition
        TypeNew = Wlc_PrsFindDefinition( p, pStart, p->vFanins, &XValue );
        if ( TypeNew )
        {
            Wlc_Obj_t * pObj = Wlc_NtkObj( p->pNtk, iObj );
            Wlc_ObjUpdateType( p->pNtk, pObj, TypeNew );
            Wlc_ObjAddFanins( p->pNtk, pObj, p->vFanins );
            pObj->fXConst = XValue;
        }
        break;
    }
    return 1;
}